

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_symbols(set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *v)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string local_250;
  fstream f;
  ostream local_220 [512];
  
  std::fstream::fstream(&f);
  std::fstream::open((char *)&f,0x10e02a);
  for (p_Var2 = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(v->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    Symbol::to_string_abi_cxx11_(&local_250,(Symbol *)(p_Var2 + 1));
    poVar1 = std::operator<<(local_220,(string *)&local_250);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_250);
  }
  std::fstream::close();
  std::fstream::~fstream(&f);
  return;
}

Assistant:

void print_symbols(const set<Symbol> &v) {
    fstream f;
    f.open("symbol.txt", ios::out);
    for (const auto &it : v) {
        f << it.to_string() << endl;
    }
    f.close();
}